

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void sync_fpmt_workers(AV1_PRIMARY *ppi,int frames_in_parallel_set)

{
  bool bVar1;
  int iVar2;
  AVxWorkerInterface *pAVar3;
  long in_RDI;
  AVxWorker *worker;
  int i;
  aom_internal_error_info *error;
  int had_error;
  int num_workers;
  AVxWorkerInterface *winterface;
  aom_internal_error_info *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  
  pAVar3 = aom_get_worker_interface();
  iVar4 = *(int *)(in_RDI + 0x12440);
  bVar1 = false;
  while (iVar4 = iVar4 + -1, -1 < iVar4) {
    in_stack_ffffffffffffffc8 = *(aom_internal_error_info **)(in_RDI + 0x12420 + (long)iVar4 * 8);
    iVar2 = (*pAVar3->sync)((AVxWorker *)in_stack_ffffffffffffffc8);
    if (iVar2 == 0) {
      bVar1 = true;
    }
  }
  restore_workers_after_fpmt((AV1_PRIMARY *)worker,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (bVar1) {
    aom_internal_error_copy
              ((aom_internal_error_info *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static inline void sync_fpmt_workers(AV1_PRIMARY *ppi,
                                     int frames_in_parallel_set) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int num_workers = ppi->p_mt_info.p_num_workers;
  int had_error = 0;
  // Points to error in the earliest display order frame in the parallel set.
  const struct aom_internal_error_info *error = NULL;

  // Encoding ends.
  for (int i = num_workers - 1; i >= 0; --i) {
    AVxWorker *const worker = ppi->p_mt_info.p_workers[i];
    if (!winterface->sync(worker)) {
      had_error = 1;
      error = ppi->parallel_cpi[i]->common.error;
    }
  }

  restore_workers_after_fpmt(ppi, frames_in_parallel_set,
                             ppi->p_mt_info.num_workers);

  if (had_error) aom_internal_error_copy(&ppi->error, error);
}